

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCIIHexDecoder.hh
# Opt level: O0

void __thiscall Pl_ASCIIHexDecoder::~Pl_ASCIIHexDecoder(Pl_ASCIIHexDecoder *this)

{
  Pl_ASCIIHexDecoder *this_local;
  
  ~Pl_ASCIIHexDecoder(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~Pl_ASCIIHexDecoder() final = default;